

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall ShallowPrint::print(ShallowPrint *this,CourseComponent *root)

{
  ostream *poVar1;
  pointer ppCVar2;
  _Vector_base<CourseComponent_*,_std::allocator<CourseComponent_*>_> local_60;
  string local_48 [32];
  
  (*(root->super_Observer)._vptr_Observer[6])(&local_60);
  for (ppCVar2 = local_60._M_impl.super__Vector_impl_data._M_start;
      ppCVar2 != local_60._M_impl.super__Vector_impl_data._M_finish; ppCVar2 = ppCVar2 + 1) {
    (*((*ppCVar2)->super_Observer)._vptr_Observer[3])(local_48);
    poVar1 = std::operator<<((ostream *)&std::cout,local_48);
    std::operator<<(poVar1," | ");
    std::__cxx11::string::~string(local_48);
  }
  std::_Vector_base<CourseComponent_*,_std::allocator<CourseComponent_*>_>::~_Vector_base(&local_60)
  ;
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void print(CourseComponent* root) {
        for (auto course : root->getCourseVector()) {
            cout << course->getCourseName() << " | ";
        }
        cout << endl;
    }